

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestVerifyUint32BigFieldNumber::ByteSizeLong(TestVerifyUint32BigFieldNumber *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  RepeatedPtrField<edition_unittest::TestAllTypes> *this_00;
  reference value;
  uint32_t *puVar5;
  size_t sVar6;
  TestAllTypes *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<edition_unittest::TestAllTypes> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestVerifyUint32BigFieldNumber *this_;
  TestVerifyUint32BigFieldNumber *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_repeated_all_types_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_repeated_all_types(this);
  __end2 = google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes>::begin(this_00);
  msg = (TestAllTypes *)
        google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes>::end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::TestAllTypes>::
            operator*(&__end2);
    sVar6 = google::protobuf::internal::WireFormatLite::MessageSize<edition_unittest::TestAllTypes>
                      (value);
    sStack_58 = sVar6 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::TestAllTypes>::
    operator++(&__end2);
  }
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestAllTypes>
                        ((this->field_0)._impl_.optional_all_types_);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      uVar4 = _internal_optional_uint32_1(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar4);
      sStack_58 = sVar6 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      uVar4 = _internal_optional_uint32_2(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar4);
      sStack_58 = sVar6 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      uVar4 = _internal_optional_uint32_63(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar4);
      sStack_58 = sVar6 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar4 = _internal_optional_uint32_64(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar4);
      sStack_58 = sVar6 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      uVar4 = _internal_optional_uint32_1000(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar4);
      sStack_58 = sVar6 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      uVar4 = _internal_optional_uint32_65(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar4);
      sStack_58 = sVar6 + 2 + sStack_58;
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t TestVerifyUint32BigFieldNumber::ByteSizeLong() const {
  const TestVerifyUint32BigFieldNumber& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestVerifyUint32BigFieldNumber)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .edition_unittest.TestAllTypes repeated_all_types = 10;
    {
      total_size += 1UL * this_._internal_repeated_all_types_size();
      for (const auto& msg : this_._internal_repeated_all_types()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // .edition_unittest.TestAllTypes optional_all_types = 9;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_all_types_);
    }
    // uint32 optional_uint32_1 = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32_1());
    }
    // uint32 optional_uint32_2 = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32_2());
    }
    // uint32 optional_uint32_63 = 63;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_63());
    }
    // uint32 optional_uint32_64 = 64;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_64());
    }
    // uint32 optional_uint32_1000 = 1000;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_1000());
    }
    // uint32 optional_uint32_65 = 65;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_65());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}